

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  undefined1 auVar1 [16];
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  int64_t j;
  real d;
  long local_28;
  real local_1c;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x55,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
  }
  if (in_RDX < in_RDI[1]) {
    if (*in_RSI == in_RDI[2]) {
      local_1c = 0.0;
      for (local_28 = 0; local_28 < in_RDI[2]; local_28 = local_28 + 1) {
        auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI[1] + local_28 * 4)),
                                 ZEXT416(*(uint *)(*in_RDI + (in_RDX * in_RDI[2] + local_28) * 4)),
                                 ZEXT416((uint)local_1c));
        local_1c = auVar1._0_4_;
      }
      return local_1c;
    }
    __assert_fail("vec.m_ == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x57,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                ,0x56,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.m_ == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += data_[i * n_ + j] * vec.data_[j];
  }
  return d;
}